

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

char * __thiscall argo::json::get_instance_type_name(json *this)

{
  json *this_local;
  
  switch(this->m_type) {
  case object_e:
    this_local = (json *)0x1292db;
    break;
  case array_e:
    this_local = (json *)0x1292bd;
    break;
  case boolean_e:
    this_local = (json *)0x12930c;
    break;
  case null_e:
    this_local = (json *)anon_var_dwarf_2db8;
    break;
  case number_int_e:
    this_local = (json *)anon_var_dwarf_2dcf;
    break;
  case number_double_e:
    this_local = (json *)anon_var_dwarf_2de6;
    break;
  case string_e:
    this_local = (json *)0x129731;
    break;
  default:
    this_local = (json *)anon_var_dwarf_2e08;
  }
  return (char *)this_local;
}

Assistant:

const char *json::get_instance_type_name() const
{
    switch (m_type)
    {
    case object_e:
        return "object";
    case array_e:
        return "array";
    case boolean_e:
        return "boolean";
    case null_e:
        return "null";
    case number_int_e:
        return "number (int)";
    case number_double_e:
        return "number (double)";
    case string_e:
        return "string";
    default:
        return "corrupted";
    }
}